

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

void __thiscall
ON_SubDComponentRefList::Internal_CopyFrom
          (ON_SubDComponentRefList *this,ON_SubDComponentRefList *src)

{
  ON_SubDComponentRef *src_00;
  int iVar1;
  int iVar2;
  int iVar3;
  ON_SubDComponentRef *in_RAX;
  ON_SubDComponentRef *this_00;
  ulong uVar4;
  ulong new_capacity;
  ON_SubDComponentRef *local_38;
  
  new_capacity = (ulong)(uint)(src->m_list).m_count;
  iVar3 = (this->m_list).m_capacity;
  local_38 = in_RAX;
  if ((ulong)(long)iVar3 < new_capacity) {
    ON_SimpleArray<ON_SubDComponentRef_*>::SetCapacity(&this->m_list,new_capacity);
    iVar3 = (this->m_list).m_capacity;
  }
  if (-1 < iVar3) {
    (this->m_list).m_count = 0;
  }
  if (new_capacity != 0) {
    uVar4 = 0;
    do {
      src_00 = (src->m_list).m_a[uVar4];
      if (src_00 == (ON_SubDComponentRef *)0x0) {
        local_38 = (ON_SubDComponentRef *)0x0;
      }
      else {
        this_00 = (ON_SubDComponentRef *)operator_new(0x40);
        ON_SubDComponentRef::ON_SubDComponentRef(this_00,src_00);
        local_38 = this_00;
      }
      ON_SimpleArray<ON_SubDComponentRef_*>::Append(&this->m_list,&local_38);
      iVar3 = src->m_subd_vertex_smooth_count;
      iVar1 = src->m_subd_vertex_dart_count;
      iVar2 = src->m_subd_vertex_crease_count;
      this->m_subd_count = src->m_subd_count;
      this->m_subd_vertex_smooth_count = iVar3;
      this->m_subd_vertex_dart_count = iVar1;
      this->m_subd_vertex_crease_count = iVar2;
      iVar3 = src->m_subd_edge_smooth_count;
      iVar1 = src->m_subd_edge_crease_count;
      iVar2 = src->m_subd_face_count;
      this->m_subd_vertex_corner_count = src->m_subd_vertex_corner_count;
      this->m_subd_edge_smooth_count = iVar3;
      this->m_subd_edge_crease_count = iVar1;
      this->m_subd_face_count = iVar2;
      this->m_bIsClean = src->m_bIsClean;
      uVar4 = uVar4 + 1;
    } while (new_capacity != uVar4);
  }
  return;
}

Assistant:

void ON_SubDComponentRefList::Internal_CopyFrom(const ON_SubDComponentRefList& src)
{
  const unsigned int count = src.m_list.UnsignedCount();
  m_list.Reserve(count);
  m_list.SetCount(0);
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDComponentRef* p = src.m_list[i];
    if (nullptr == p)
      m_list.Append(nullptr);
    else
      m_list.Append(new ON_SubDComponentRef(*p));

    m_subd_count = src.m_subd_count;
    m_subd_vertex_smooth_count = src.m_subd_vertex_smooth_count;
    m_subd_vertex_dart_count = src.m_subd_vertex_dart_count;
    m_subd_vertex_crease_count = src.m_subd_vertex_crease_count;
    m_subd_vertex_corner_count = src.m_subd_vertex_corner_count;
    m_subd_edge_smooth_count = src.m_subd_edge_smooth_count;
    m_subd_edge_crease_count = src.m_subd_edge_crease_count;
    m_subd_face_count = src.m_subd_face_count;

    m_bIsClean = src.m_bIsClean;
  }
}